

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_l3.c
# Opt level: O0

int picnic3_l3_verify(picnic3_l3_publickey_t *pk,uint8_t *message,size_t message_len,
                     uint8_t *signature,size_t signature_len)

{
  picnic_instance_t *ppVar1;
  long in_RCX;
  long in_RDI;
  long in_R8;
  uint8_t *in_stack_00000008;
  uint8_t *pk_pt;
  uint8_t *pk_c;
  picnic_instance_t *instance;
  undefined4 local_4;
  
  if (((in_RDI == 0) || (in_RCX == 0)) || (in_R8 == 0)) {
    local_4 = -1;
  }
  else {
    ppVar1 = picnic_instance_get(Picnic3_L3);
    if (ppVar1 == (picnic_instance_t *)0x0) {
      local_4 = -1;
    }
    else {
      local_4 = impl_verify_picnic3((picnic_instance_t *)signature,(uint8_t *)signature_len,
                                    (uint8_t *)instance,pk_c,(size_t)pk_pt,in_stack_00000008,
                                    (size_t)message);
    }
  }
  return local_4;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic3_l3_verify(const picnic3_l3_publickey_t* pk,
                                                  const uint8_t* message, size_t message_len,
                                                  const uint8_t* signature, size_t signature_len) {
  if (!pk || !signature || !signature_len) {
    return -1;
  }

  const picnic_instance_t* instance = picnic_instance_get(PARAM);
  if (!instance) {
    return -1;
  }

  const uint8_t* pk_c  = PK_C(pk);
  const uint8_t* pk_pt = PK_PT(pk);

  return impl_verify_picnic3(instance, pk_pt, pk_c, message, message_len, signature,
                               signature_len);
}